

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_names_section(parser *p)

{
  uint uVar1;
  uint *puVar2;
  parser_error pVar3;
  
  uVar1 = parser_getuint(p,"section");
  puVar2 = (uint *)parser_priv(p);
  pVar3 = PARSE_ERROR_OUT_OF_BOUNDS;
  if (uVar1 < 3) {
    *puVar2 = uVar1;
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_names_section(struct parser *p) {
	unsigned int section = parser_getuint(p, "section");
	struct names_parse *s = parser_priv(p);

	if (section >= RANDNAME_NUM_TYPES) {
		return PARSE_ERROR_OUT_OF_BOUNDS;
	}
	s->section = section;
	return PARSE_ERROR_NONE;
}